

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vp8l_enc.c
# Opt level: O0

int WriteImage(WebPPicture *pic,VP8LBitWriter *bw,size_t *coded_size)

{
  int iVar1;
  uint8_t *puVar2;
  WebPPicture *pic_00;
  undefined1 *riff_size_00;
  ulong vp8l_size_00;
  long *in_RDX;
  VP8LBitWriter *in_RSI;
  WebPPicture *in_RDI;
  uint8_t pad_byte [1];
  size_t riff_size;
  size_t pad;
  size_t vp8l_size;
  size_t webpll_size;
  uint8_t *webpll_data;
  uint8_t local_49;
  long local_48;
  int local_4;
  
  puVar2 = VP8LBitWriterFinish((VP8LBitWriter *)0x1b005d);
  pic_00 = (WebPPicture *)VP8LBitWriterNumBytes(in_RSI);
  riff_size_00 = (undefined1 *)((long)&pic_00->use_argb + 1);
  vp8l_size_00 = (ulong)riff_size_00 & 1;
  local_48 = (long)pic_00->pad1 + (vp8l_size_00 - 0x2f);
  *in_RDX = 0;
  if (in_RSI->error == 0) {
    iVar1 = WriteRiffHeader(pic_00,(size_t)riff_size_00,vp8l_size_00);
    if ((iVar1 == 0) || (iVar1 = (*in_RDI->writer)(puVar2,(size_t)pic_00,in_RDI), iVar1 == 0)) {
      local_4 = WebPEncodingSetError(in_RDI,VP8_ENC_ERROR_BAD_WRITE);
    }
    else {
      if (vp8l_size_00 != 0) {
        memset(&local_49,0,1);
        iVar1 = (*in_RDI->writer)(&local_49,1,in_RDI);
        if (iVar1 == 0) {
          iVar1 = WebPEncodingSetError(in_RDI,VP8_ENC_ERROR_BAD_WRITE);
          return iVar1;
        }
      }
      *in_RDX = local_48 + 8;
      local_4 = 1;
    }
  }
  else {
    local_4 = WebPEncodingSetError(in_RDI,VP8_ENC_ERROR_OUT_OF_MEMORY);
  }
  return local_4;
}

Assistant:

static int WriteImage(const WebPPicture* const pic, VP8LBitWriter* const bw,
                      size_t* const coded_size) {
  const uint8_t* const webpll_data = VP8LBitWriterFinish(bw);
  const size_t webpll_size = VP8LBitWriterNumBytes(bw);
  const size_t vp8l_size = VP8L_SIGNATURE_SIZE + webpll_size;
  const size_t pad = vp8l_size & 1;
  const size_t riff_size = TAG_SIZE + CHUNK_HEADER_SIZE + vp8l_size + pad;
  *coded_size = 0;

  if (bw->error) {
    return WebPEncodingSetError(pic, VP8_ENC_ERROR_OUT_OF_MEMORY);
  }

  if (!WriteRiffHeader(pic, riff_size, vp8l_size) ||
      !pic->writer(webpll_data, webpll_size, pic)) {
    return WebPEncodingSetError(pic, VP8_ENC_ERROR_BAD_WRITE);
  }

  if (pad) {
    const uint8_t pad_byte[1] = { 0 };
    if (!pic->writer(pad_byte, 1, pic)) {
      return WebPEncodingSetError(pic, VP8_ENC_ERROR_BAD_WRITE);
    }
  }
  *coded_size = CHUNK_HEADER_SIZE + riff_size;
  return 1;
}